

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O3

uint64_t buffer_bookmark_pop(buffer_t *buffer,int width,int height,int *error)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  
  iVar2 = buffer->bookmarks_head;
  uVar4 = 0;
  if ((long)iVar2 < 0) {
    iVar2 = 1;
  }
  else {
    buffer->bookmarks_head = iVar2 + -1;
    uVar1 = buffer->bookmarks[iVar2];
    uVar3 = uVar1 / (ulong)(long)width - ((ulong)(long)(height + -2) >> 1);
    if ((long)uVar3 < 1) {
      uVar3 = uVar4;
    }
    uVar4 = (buffer->size / (ulong)(long)width - (long)height) + 3;
    if (uVar3 < uVar4) {
      uVar4 = uVar3;
    }
    uVar3 = buffer->size - 1;
    if (uVar1 <= uVar3) {
      uVar3 = uVar1;
    }
    buffer->cursor = uVar3;
    iVar2 = 0;
  }
  *error = iVar2;
  return uVar4;
}

Assistant:

uint64_t
buffer_bookmark_pop(buffer_t *buffer, int width, int height, int *error)
{
    if (buffer->bookmarks_head >= 0) {
        uintptr_t address = buffer->bookmarks[buffer->bookmarks_head--];
        *error = 0;
        return buffer_scroll(buffer, address, width, height);
    }

    *error = 1;
    return 0;
}